

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsDomainAddOrientation
              (FmsDomain domain,FmsEntityType type,FmsInt ent_id,FmsInt loc_side_id,
              FmsOrientation side_orient)

{
  int iVar1;
  
  if (domain == (FmsDomain)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 2;
    if (0xfffffff8 < type - FMS_NUM_ENTITY_TYPES) {
      iVar1 = 3;
      if (ent_id < domain->entities_caps[type]) {
        iVar1 = 4;
        if (loc_side_id < FmsEntityNumSides[type]) {
          domain->orientations[type][loc_side_id + FmsEntityNumSides[type] * ent_id] = side_orient;
          return 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsDomainAddOrientation(FmsDomain domain, FmsEntityType type, FmsInt ent_id,
                            FmsInt loc_side_id, FmsOrientation side_orient) {
  if (!domain) { E_RETURN(1); }
  if (type == FMS_VERTEX || type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (ent_id >= domain->entities_caps[type]) { E_RETURN(3); }
  const FmsInt num_sides = FmsEntityNumSides[type];
  if (loc_side_id >= num_sides) { E_RETURN(4); }
  FmsOrientation *orientations = domain->orientations[type];
  orientations[ent_id*num_sides + loc_side_id] = side_orient;
  return 0;
}